

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::Read
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZStream *buf,void *context)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  long **pplVar4;
  ostream *poVar5;
  char *pcVar6;
  long *in_RSI;
  long *in_RDI;
  stringstream sout;
  int classid;
  TPZOneShapeRestraint one;
  int i;
  int sz;
  TPZManVector<int,_2> SideOrient;
  TPZManVector<int,_3> order;
  TPZVec<int> *in_stack_fffffffffffffcc8;
  TPZOneShapeRestraint *in_stack_fffffffffffffcd0;
  value_type *in_stack_fffffffffffffcd8;
  TPZInt1d *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  TPZManVector<int,_3> *in_stack_fffffffffffffcf0;
  string local_2c8 [8];
  TPZOneShapeRestraint *in_stack_fffffffffffffd40;
  stringstream local_2a8 [16];
  ostream local_298 [96];
  TPZStream *in_stack_fffffffffffffdc8;
  TPZOneShapeRestraint *in_stack_fffffffffffffdd0;
  int local_11c [37];
  int local_88;
  int local_84 [29];
  long *local_10;
  
  local_10 = in_RSI;
  TPZInterpolatedElement::Read
            ((TPZInterpolatedElement *)in_stack_fffffffffffffcd0,
             (TPZStream *)in_stack_fffffffffffffcc8,(void *)0x19f9391);
  plVar1 = local_10;
  pplVar4 = TPZVec<long>::begin((TPZVec<long> *)(in_RDI + 0x11));
  (**(code **)(*plVar1 + 0xf8))(plVar1,*pplVar4,3);
  TPZManVector<int,_3>::TPZManVector
            (in_stack_fffffffffffffcf0,CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
            );
  TPZStream::Read<int>((TPZStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  TPZInt1d::SetOrder(in_stack_fffffffffffffce0,(TPZVec<int> *)in_stack_fffffffffffffcd8,
                     (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  TPZManVector<int,_2>::TPZManVector
            ((TPZManVector<int,_2> *)in_stack_fffffffffffffcf0,
             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  TPZStream::Read<int>((TPZStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  TPZManVector<int,_2>::operator=
            ((TPZManVector<int,_2> *)in_stack_fffffffffffffcf0,
             (TPZManVector<int,_2> *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  plVar1 = local_10;
  pplVar4 = TPZVec<long>::begin((TPZVec<long> *)(in_RDI + 0x11));
  (**(code **)(*plVar1 + 0xf8))(plVar1,*pplVar4,3);
  (**(code **)(*local_10 + 0xe8))(local_10,in_RDI + 5,1);
  TPZStream::Read<int>((TPZStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  (**(code **)(*local_10 + 0xe8))(local_10,local_84,1);
  for (local_88 = 0; local_88 < local_84[0]; local_88 = local_88 + 1) {
    TPZOneShapeRestraint::TPZOneShapeRestraint(in_stack_fffffffffffffd40);
    TPZOneShapeRestraint::Read(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::push_back
              ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
               in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    TPZOneShapeRestraint::~TPZOneShapeRestraint(in_stack_fffffffffffffcd0);
  }
  local_11c[0] = -1;
  (**(code **)(*local_10 + 0xe8))(local_10,local_11c,1);
  iVar3 = local_11c[0];
  iVar2 = (**(code **)(*in_RDI + 0x20))();
  if (iVar3 != iVar2) {
    std::__cxx11::stringstream::stringstream(local_2a8);
    poVar5 = std::operator<<(local_298,"ERROR - ");
    poVar5 = std::operator<<(poVar5,
                             "virtual void TPZCompElHDiv<pzshape::TPZShapeLinear>::Read(TPZStream &, void *) [TSHAPE = pzshape::TPZShapeLinear]"
                            );
    poVar5 = std::operator<<(poVar5," trying to restore an object id ");
    iVar3 = (**(code **)(*in_RDI + 0x20))();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::operator<<(poVar5," and classid read = ");
    std::ostream::operator<<(poVar5,local_11c[0]);
    std::__cxx11::stringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    in_stack_fffffffffffffcd0 =
         (TPZOneShapeRestraint *)std::operator<<((ostream *)&std::cout,pcVar6);
    std::ostream::operator<<(in_stack_fffffffffffffcd0,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::stringstream::~stringstream(local_2a8);
  }
  TPZManVector<int,_2>::~TPZManVector((TPZManVector<int,_2> *)in_stack_fffffffffffffcd0);
  TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffffcd0);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Read(TPZStream &buf, void *context)
{
	TPZInterpolatedElement::Read(buf,context);
  buf.Read(fConnectIndexes.begin(),TSHAPE::NSides);
	TPZManVector<int,3> order;
	buf.Read(order);
	this-> fIntRule.SetOrder(order);
    TPZManVector<int, TSHAPE::NFacets> SideOrient;
    buf.Read(SideOrient);
    fSideOrient = SideOrient;
	buf.Read(this->fConnectIndexes.begin(),TSHAPE::NSides);
	buf.Read(&this->fPreferredOrder,1);
    buf.Read(fSideOrient);
    int sz;
    buf.Read(&sz);
    for (int i=0; i<sz; i++) {
        TPZOneShapeRestraint one;
        one.Read(buf);
        fRestraints.push_back(one);
    }
	int classid = -1;
	buf.Read( &classid, 1 );
	if ( classid != this->ClassId())
	{
		std::stringstream sout;
		sout << "ERROR - " << __PRETTY_FUNCTION__
        << " trying to restore an object id " << this->ClassId() << " and classid read = " << classid;
		LOGPZ_ERROR ( logger, sout.str().c_str() );
	}
}